

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O0

istream * embree::operator>>(istream *cin,Ref<embree::XML> *xml)

{
  long lVar1;
  long *plVar2;
  long *in_RSI;
  istream *in_RDI;
  undefined1 in_stack_00000266;
  undefined1 in_stack_00000267;
  string *in_stack_00000268;
  Ref<embree::Stream<int>_> *in_stack_00000270;
  string *in_stack_ffffffffffffff10;
  istream *in_stack_ffffffffffffff18;
  allocator *paVar3;
  StdStream *in_stack_ffffffffffffff20;
  allocator local_b9;
  string local_b8 [35];
  undefined1 local_95;
  allocator local_81;
  string local_80 [32];
  long *local_60;
  long *local_58;
  long *local_50;
  istream *local_48;
  long **local_40;
  long *local_30;
  long **local_28;
  long **local_20;
  long *local_18;
  long **local_10;
  
  local_50 = in_RSI;
  local_48 = in_RDI;
  plVar2 = (long *)operator_new(0x70);
  local_95 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"std::stream",&local_81);
  StdStream::StdStream
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  local_95 = 0;
  local_28 = &local_60;
  local_30 = plVar2;
  if (plVar2 != (long *)0x0) {
    lVar1 = *local_60;
    local_60 = plVar2;
    (**(code **)(lVar1 + 0x10))();
    plVar2 = local_60;
  }
  local_60 = plVar2;
  paVar3 = &local_b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"",paVar3);
  parseXML(in_stack_00000270,in_stack_00000268,(bool)in_stack_00000267,(bool)in_stack_00000266);
  local_18 = local_50;
  local_20 = &local_58;
  if (*local_50 != 0) {
    (**(code **)(*(long *)*local_50 + 0x18))();
  }
  *local_50 = (long)*local_20;
  *local_20 = (long *)0x0;
  local_40 = &local_58;
  if (local_58 != (long *)0x0) {
    (**(code **)(*local_58 + 0x18))();
  }
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  local_10 = &local_60;
  if (local_60 != (long *)0x0) {
    (**(code **)(*local_60 + 0x18))();
  }
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  return local_48;
}

Assistant:

std::istream& operator>>(std::istream& cin, Ref<XML>& xml) {
    xml = parseXML(new StdStream(cin),"",false,true);
    return cin;
  }